

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_resize(HSQUIRRELVM v)

{
  SQArray *this;
  HSQUIRRELVM in_RDI;
  SQInteger sz;
  SQObjectPtr fill;
  SQObject *nsize;
  SQObject *o;
  SQChar *in_stack_ffffffffffffff88;
  HSQUIRRELVM in_stack_ffffffffffffff90;
  SQObjectPtr *in_stack_ffffffffffffff98;
  long local_50;
  SQObjectPtr local_30;
  SQObjectPtr *local_20;
  SQObjectPtr *local_18;
  HSQUIRRELVM local_10;
  HSQUIRRELVM local_8;
  
  local_10 = in_RDI;
  local_18 = stack_get(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
  local_20 = stack_get(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
  SQObjectPtr::SQObjectPtr(&local_30);
  if (((local_20->super_SQObject)._type & 0x4000000) == 0) {
    in_stack_ffffffffffffff90 =
         (HSQUIRRELVM)sq_throwerror(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_8 = in_stack_ffffffffffffff90;
  }
  else {
    if ((local_20->super_SQObject)._type == OT_FLOAT) {
      local_50 = (long)(local_20->super_SQObject)._unVal.fFloat;
    }
    else {
      local_50 = (local_20->super_SQObject)._unVal.nInteger;
    }
    if (local_50 < 0) {
      local_8 = (HSQUIRRELVM)sq_throwerror(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      this = (SQArray *)sq_gettop(local_10);
      if (2 < (long)this) {
        in_stack_ffffffffffffff98 =
             stack_get(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
        SQObjectPtr::operator=((SQObjectPtr *)this,in_stack_ffffffffffffff98);
      }
      SQArray::Resize(this,(SQInteger)in_stack_ffffffffffffff98,
                      (SQObjectPtr *)in_stack_ffffffffffffff90);
      sq_settop(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
      local_8 = (HSQUIRRELVM)0x1;
    }
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff90);
  return (SQInteger)local_8;
}

Assistant:

static SQInteger array_resize(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v, 1);
    SQObject &nsize = stack_get(v, 2);
    SQObjectPtr fill;
    if(sq_isnumeric(nsize)) {
        SQInteger sz = tointeger(nsize);
        if (sz<0)
          return sq_throwerror(v, _SC("resizing to negative length"));

        if(sq_gettop(v) > 2)
            fill = stack_get(v, 3);
        _array(o)->Resize(sz,fill);
        sq_settop(v, 1);
        return 1;
    }
    return sq_throwerror(v, _SC("size must be a number"));
}